

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xatlas.cpp
# Opt level: O0

uint32_t __thiscall xatlas::internal::AABB::maxDimension(AABB *this)

{
  Vector3 VVar1;
  uint32_t local_34;
  uint32_t result;
  float local_28;
  float local_1c;
  float fStack_18;
  Vector3 extent;
  AABB *this_local;
  
  VVar1 = operator-(&this->max,&this->min);
  local_28 = VVar1.z;
  local_34 = 0;
  fStack_18 = VVar1.y;
  local_1c = VVar1.x;
  if (fStack_18 <= local_1c) {
    if (local_1c < local_28) {
      local_34 = 2;
    }
  }
  else {
    local_34 = 1;
    if (fStack_18 < local_28) {
      local_34 = 2;
    }
  }
  return local_34;
}

Assistant:

uint32_t maxDimension() const
	{
		const Vector3 extent = max - min;
		uint32_t result = 0;
		if (extent.y > extent.x) {
			result = 1;
			if (extent.z > extent.y)
				result = 2;
		}
		else if(extent.z > extent.x)
			result = 2;
		return result;
	}